

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

Error httplib::detail::wait_until_socket_is_ready(socket_t sock,time_t sec,time_t usec)

{
  anon_class_40_5_fce8b38b fn;
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  long lVar4;
  Error EVar5;
  __fd_mask *p_Var6;
  __fd_mask *p_Var7;
  undefined1 auStack_1e0 [12];
  socket_t sock_local;
  socklen_t len;
  int error;
  socket_t *local_1c8;
  __fd_mask *p_Stack_1c0;
  __fd_mask *local_1b8;
  __fd_mask *p_Stack_1b0;
  timeval *local_1a8;
  timeval tv;
  fd_set fdsr;
  fd_set fdsw;
  fd_set fdse;
  
  if (sock < 0x400) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      fdsr.fds_bits[lVar2] = 0;
    }
    fdsr.fds_bits[sock / 0x40] = fdsr.fds_bits[sock / 0x40] | 1L << ((byte)sock & 0x3f);
    local_1b8 = fdsw.fds_bits;
    p_Stack_1c0 = fdsr.fds_bits;
    lVar2 = 0x10;
    p_Var6 = p_Stack_1c0;
    p_Var7 = local_1b8;
    for (lVar4 = lVar2; lVar4 != 0; lVar4 = lVar4 + -1) {
      *p_Var7 = *p_Var6;
      p_Var6 = p_Var6 + 1;
      p_Var7 = p_Var7 + 1;
    }
    p_Stack_1b0 = fdse.fds_bits;
    p_Var6 = p_Stack_1c0;
    p_Var7 = p_Stack_1b0;
    for (; lVar2 != 0; lVar2 = lVar2 + -1) {
      *p_Var7 = *p_Var6;
      p_Var6 = p_Var6 + 1;
      p_Var7 = p_Var7 + 1;
    }
    local_1a8 = &tv;
    local_1c8 = &sock_local;
    fn.fdsr = (fd_set *)local_1a8;
    fn.sock = (socket_t *)p_Stack_1b0;
    fn._16_12_ = auStack_1e0;
    fn.fdse._4_4_ = sock;
    fn.tv._0_4_ = len;
    fn.tv._4_4_ = error;
    sock_local = sock;
    tv.tv_sec = sec;
    tv.tv_usec = usec;
    sVar3 = handle_EINTR<httplib::detail::wait_until_socket_is_ready(int,long,long)::_lambda()_1_>
                      (fn);
    if (sVar3 == 0) {
      EVar5 = ConnectionTimeout;
    }
    else {
      EVar5 = Connection;
      if (0 < sVar3) {
        if ((((ulong)fdsr.fds_bits[sock_local / 0x40] >> ((long)sock_local % 0x40 & 0x3fU) & 1) != 0
            ) || ((fdsw.fds_bits[sock_local / 0x40] & 1L << ((byte)((long)sock_local % 0x40) & 0x3f)
                  ) != 0)) {
          error = 0;
          len = 4;
          iVar1 = getsockopt(sock_local,1,4,&error,&len);
          EVar5 = (uint)(error != 0 || iVar1 < 0) * 2;
        }
      }
    }
  }
  else {
    EVar5 = Connection;
  }
  return EVar5;
}

Assistant:

inline Error wait_until_socket_is_ready(socket_t sock, time_t sec,
            time_t usec) {
        #ifdef CPPHTTPLIB_USE_POLL
            struct pollfd pfd_read;
            pfd_read.fd = sock;
            pfd_read.events = POLLIN | POLLOUT;

            auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

            auto poll_res = handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });

            if (poll_res == 0) { return Error::ConnectionTimeout; }

            if (poll_res > 0 && pfd_read.revents & (POLLIN | POLLOUT)) {
                int error = 0;
                socklen_t len = sizeof(error);
                auto res = getsockopt(sock, SOL_SOCKET, SO_ERROR,
                    reinterpret_cast<char*>(&error), &len);
                auto successful = res >= 0 && !error;
                return successful ? Error::Success : Error::Connection;
            }

            return Error::Connection;
        #else
        #ifndef _WIN32
            if (sock >= FD_SETSIZE) { return Error::Connection; }
        #endif

            fd_set fdsr;
            FD_ZERO(&fdsr);
            FD_SET(sock, &fdsr);

            auto fdsw = fdsr;
            auto fdse = fdsr;

            timeval tv;
            tv.tv_sec = static_cast<long>(sec);
            tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

            auto ret = handle_EINTR([&]() {
                return select(static_cast<int>(sock + 1), &fdsr, &fdsw, &fdse, &tv);
            });

            if (ret == 0) { return Error::ConnectionTimeout; }

            if (ret > 0 && (FD_ISSET(sock, &fdsr) || FD_ISSET(sock, &fdsw))) {
                int error = 0;
                socklen_t len = sizeof(error);
                auto res = getsockopt(sock, SOL_SOCKET, SO_ERROR,
                    reinterpret_cast<char*>(&error), &len);
                auto successful = res >= 0 && !error;
                return successful ? Error::Success : Error::Connection;
            }
            return Error::Connection;
        #endif
        }